

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O2

backtracer * __thiscall spdlog::details::backtracer::operator=(backtracer *this,backtracer *other)

{
  std::mutex::lock((mutex *)this);
  LOCK();
  (this->enabled_)._M_base._M_i = (__int_type)((other->enabled_)._M_base._M_i & 1);
  UNLOCK();
  circular_q<spdlog::details::log_msg_buffer>::copy_moveable(&this->messages_,&other->messages_);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return this;
}

Assistant:

SPDLOG_INLINE backtracer &backtracer::operator=(backtracer other) {
    std::lock_guard<std::mutex> lock(mutex_);
    enabled_ = other.enabled();
    messages_ = std::move(other.messages_);
    return *this;
}